

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

Float __thiscall pbrt::FloatPtexTexture::Evaluate(FloatPtexTexture *this,TextureEvalContext ctx)

{
  TextureEvalContext ctx_00;
  int iVar1;
  undefined1 auVar2 [64];
  float *in_stack_00000070;
  PtexTextureBase *in_stack_00000078;
  int nc;
  float result [3];
  undefined4 uStack00000000000000a0;
  undefined4 uStack00000000000000a4;
  undefined4 uStack00000000000000a8;
  undefined4 uStack00000000000000ac;
  undefined1 local_60 [64];
  float local_1c;
  float local_18;
  float local_14;
  float local_4;
  
  memcpy(local_60,&stack0x00000008,0x40);
  auVar2 = vmovdqu64_avx512f(local_60);
  vmovdqu64_avx512f(auVar2);
  ctx_00._8_8_ = this;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = result._4_8_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack00000000000000a0;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack00000000000000a4;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack00000000000000a8;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack00000000000000ac;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  ctx_00.dudx = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  ctx_00.dudy = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  ctx_00.dvdx = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  ctx_00.dvdy = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  ctx_00.faceIndex = (int)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  iVar1 = PtexTextureBase::SampleTexture(in_stack_00000078,ctx_00,in_stack_00000070);
  if (iVar1 == 1) {
    local_4 = local_1c;
  }
  else {
    local_4 = (local_1c + local_18 + local_14) / 3.0;
  }
  return local_4;
}

Assistant:

Float FloatPtexTexture::Evaluate(TextureEvalContext ctx) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return 0;
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return result[0];
    DCHECK_EQ(3, nc);
    return (result[0] + result[1] + result[2]) / 3;
#endif
}